

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkInterOne(Abc_Ntk_t *pNtkOn,Abc_Ntk_t *pNtkOff,int fRelation,int fVerbose)

{
  Aig_Man_t *pManOn;
  Aig_Man_t *pManOff;
  Aig_Man_t *pMan;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pAVar1;
  char *format;
  
  if ((pNtkOn->vCos->nSize == 1) && (pNtkOff->vCos->nSize == 1)) {
    if (pNtkOn->vCis->nSize == pNtkOff->vCis->nSize) {
      pManOn = Abc_NtkToDar(pNtkOn,0,0);
      if (pManOn == (Aig_Man_t *)0x0) {
        return (Abc_Ntk_t *)0x0;
      }
      pManOff = Abc_NtkToDar(pNtkOff,0,0);
      if (pManOff == (Aig_Man_t *)0x0) {
        return (Abc_Ntk_t *)0x0;
      }
      pNtkOn = (Abc_Ntk_t *)pManOn;
      pMan = Aig_ManInter(pManOn,pManOff,fRelation,fVerbose);
      if (pMan != (Aig_Man_t *)0x0) {
        Aig_ManStop(pManOn);
        Aig_ManStop(pManOff);
        if (fRelation != 0) {
          pObj = Abc_NtkCreateObj(pNtkOff,ABC_OBJ_PI);
          Abc_ObjAssignName(pObj,"New",(char *)0x0);
        }
        pAVar1 = Abc_NtkFromDar(pNtkOff,pMan);
        Aig_ManStop(pMan);
        return pAVar1;
      }
      format = "Interpolant computation failed.\n";
    }
    else {
      format = "The number of PIs should be the same.\n";
    }
  }
  else {
    format = "Currently works only for single-output networks.\n";
  }
  Abc_Print((int)pNtkOn,format);
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_NtkInterOne( Abc_Ntk_t * pNtkOn, Abc_Ntk_t * pNtkOff, int fRelation, int fVerbose )
{
    extern Aig_Man_t * Aig_ManInter( Aig_Man_t * pManOn, Aig_Man_t * pManOff, int fRelation, int fVerbose );
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pManOn, * pManOff, * pManAig;
    if ( Abc_NtkCoNum(pNtkOn) != 1 || Abc_NtkCoNum(pNtkOff) != 1 )
    {
        Abc_Print( 1, "Currently works only for single-output networks.\n" );
        return NULL;
    }
    if ( Abc_NtkCiNum(pNtkOn) != Abc_NtkCiNum(pNtkOff) )
    {
        Abc_Print( 1, "The number of PIs should be the same.\n" );
        return NULL;
    }
    // create internal AIGs
    pManOn = Abc_NtkToDar( pNtkOn, 0, 0 );
    if ( pManOn == NULL )
        return NULL;
    pManOff = Abc_NtkToDar( pNtkOff, 0, 0 );
    if ( pManOff == NULL )
        return NULL;
    // derive the interpolant
    pManAig = Aig_ManInter( pManOn, pManOff, fRelation, fVerbose );
    if ( pManAig == NULL )
    {
        Abc_Print( 1, "Interpolant computation failed.\n" );
        return NULL;
    }
    Aig_ManStop( pManOn );
    Aig_ManStop( pManOff );
    // for the relation, add an extra input
    if ( fRelation )
    {
        Abc_Obj_t * pObj;
        pObj = Abc_NtkCreatePi( pNtkOff );
        Abc_ObjAssignName( pObj, "New", NULL );
    }
    // create logic network
    pNtkAig = Abc_NtkFromDar( pNtkOff, pManAig );
    Aig_ManStop( pManAig );
    return pNtkAig;
}